

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O1

void RigidBodyDynamics::Utils::CalcZeroMomentPoint
               (Model *model,VectorNd *q,VectorNd *qdot,VectorNd *qddot,Vector3d *zmp,
               Vector3d *normal,Vector3d *point,bool update_kinematics)

{
  double *pdVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  pointer pSVar10;
  pointer pSVar11;
  pointer pSVar12;
  pointer pSVar13;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  ulong uVar24;
  RBDLError *this;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  SpatialVector hdot_tot;
  double local_1d8;
  double local_1c8;
  double local_1b8;
  double dStack_1b0;
  undefined1 local_1a8 [80];
  double dStack_158;
  double local_150;
  undefined1 local_148 [24];
  Vector3d *local_130;
  Vector3d *local_128;
  long local_120;
  undefined1 local_118 [40];
  double dStack_f0;
  string local_e8;
  SpatialTransform local_c8;
  SpatialVector local_68;
  
  if (zmp == (Vector3d *)0x0) {
    this = (RBDLError *)__cxa_allocate_exception(0x28);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"ZMP (output) is \'NULL\'!\n","");
    Errors::RBDLError::RBDLError(this,&local_e8);
    __cxa_throw(this,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
  }
  local_130 = normal;
  local_128 = zmp;
  if (update_kinematics) {
    UpdateKinematicsCustom(model,q,qdot,qddot);
  }
  uVar24 = ((long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
  if (1 < uVar24) {
    uVar30 = 1;
    lVar27 = 0x50;
    lVar29 = 0x30;
    do {
      pSVar10 = (model->I).
                super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                .
                super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar11 = (model->Ic).
                super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                .
                super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&(pSVar11->h).super_Vector3d + lVar27 + -8) =
           *(undefined8 *)((long)&(pSVar10->h).super_Vector3d + lVar27 + -8);
      puVar2 = (undefined8 *)((long)&(pSVar10->h).super_Vector3d + lVar27);
      uVar18 = puVar2[1];
      puVar3 = (undefined8 *)((long)&(pSVar11->h).super_Vector3d + lVar27);
      *puVar3 = *puVar2;
      puVar3[1] = uVar18;
      *(undefined8 *)((long)&(pSVar11->h).super_Vector3d + lVar27 + 0x10U) =
           *(undefined8 *)((long)&(pSVar10->h).super_Vector3d + lVar27 + 0x10U);
      puVar2 = (undefined8 *)((long)(&pSVar10->h + 1) + lVar27);
      uVar18 = puVar2[1];
      puVar3 = (undefined8 *)((long)(&pSVar10->h + 1) + 0x10U + lVar27);
      uVar19 = *puVar3;
      uVar20 = puVar3[1];
      puVar3 = (undefined8 *)((long)(&pSVar10->h + 2) + 8U + lVar27);
      uVar21 = *puVar3;
      uVar22 = puVar3[1];
      puVar3 = (undefined8 *)((long)(&pSVar11->h + 1) + lVar27);
      *puVar3 = *puVar2;
      puVar3[1] = uVar18;
      puVar2 = (undefined8 *)((long)(&pSVar11->h + 1) + 0x10U + lVar27);
      *puVar2 = uVar19;
      puVar2[1] = uVar20;
      puVar2 = (undefined8 *)((long)(&pSVar11->h + 2) + 8U + lVar27);
      *puVar2 = uVar21;
      puVar2[1] = uVar22;
      Math::SpatialRigidBodyInertia::operator*
                ((SpatialRigidBodyInertia *)
                 ((long)&(((model->Ic).
                           super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                           ._M_impl.super__Vector_impl_data._M_start)->h).super_Vector3d +
                 lVar27 + -8),
                 (SpatialVector *)
                 ((long)&(((model->a).
                           super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                           .
                           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_Matrix<double,_6,_1,_0,_6,_1>).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar29));
      pSVar12 = (model->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      Math::SpatialRigidBodyInertia::operator*
                ((SpatialRigidBodyInertia *)
                 ((long)&(((model->Ic).
                           super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                           ._M_impl.super__Vector_impl_data._M_start)->h).super_Vector3d +
                 lVar27 + -8),
                 (SpatialVector *)
                 ((long)&(pSVar12->super_Matrix<double,_6,_1,_0,_6,_1>).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar29));
      dVar5 = *(double *)
               ((long)&(pSVar12->super_Matrix<double,_6,_1,_0,_6,_1>).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar29 + 0x10)
      ;
      dVar6 = *(double *)
               ((long)&(pSVar12->super_Matrix<double,_6,_1,_0,_6,_1>).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar29);
      dVar33 = *(double *)
                ((long)&(pSVar12->super_Matrix<double,_6,_1,_0,_6,_1>).
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar29 + 8);
      dVar7 = *(double *)
               ((long)&(pSVar12->super_Matrix<double,_6,_1,_0,_6,_1>).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar29 + 0x28)
      ;
      dVar8 = *(double *)
               ((long)&(pSVar12->super_Matrix<double,_6,_1,_0,_6,_1>).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar29 + 0x20)
      ;
      dVar9 = *(double *)
               ((long)&(pSVar12->super_Matrix<double,_6,_1,_0,_6,_1>).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar29 + 0x18)
      ;
      pSVar12 = (model->hdotc).
                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pdVar1 = (double *)
               ((long)&(pSVar12->super_Matrix<double,_6,_1,_0,_6,_1>).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar29);
      *pdVar1 = dVar8 * local_c8.E.super_Matrix3d.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array[5] +
                local_c8.E.super_Matrix3d.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                [4] * -dVar7 +
                -dVar5 * local_c8.E.super_Matrix3d.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                         m_data.array[1] +
                dVar33 * local_c8.E.super_Matrix3d.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                         m_data.array[2] + (double)local_1a8._0_8_;
      pdVar1[1] = -dVar9 * local_c8.E.super_Matrix3d.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data.array[5] +
                  local_c8.E.super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[3] * dVar7 +
                  dVar5 * local_c8.E.super_Matrix3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array[0] +
                  -dVar6 * local_c8.E.super_Matrix3d.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data.array[2] + (double)local_1a8._8_8_;
      pdVar1 = (double *)
               ((long)&(pSVar12->super_Matrix<double,_6,_1,_0,_6,_1>).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar29 + 0x10)
      ;
      *pdVar1 = local_c8.E.super_Matrix3d.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                [4] * dVar9 +
                ((local_c8.E.super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[1] * dVar6 -
                 dVar33 * local_c8.E.super_Matrix3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array[0]) -
                dVar8 * local_c8.E.super_Matrix3d.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array[3]) + (double)local_1a8._16_8_;
      pdVar1[1] = local_c8.E.super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[4] * -dVar5 +
                  local_c8.E.super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[5] * dVar33 + (double)local_1a8._24_8_;
      pdVar1 = (double *)
               ((long)&(pSVar12->super_Matrix<double,_6,_1,_0,_6,_1>).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar29 + 0x20)
      ;
      *pdVar1 = local_c8.E.super_Matrix3d.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                [3] * dVar5 +
                -dVar6 * local_c8.E.super_Matrix3d.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                         m_data.array[5] + (double)local_1a8._32_8_;
      pdVar1[1] = local_c8.E.super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[3] * -dVar33 +
                  dVar6 * local_c8.E.super_Matrix3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array[4] + (double)local_1a8._40_8_;
      uVar30 = uVar30 + 1;
      uVar24 = ((long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      lVar27 = lVar27 + 0x50;
      lVar29 = lVar29 + 0x30;
    } while (uVar30 < uVar24);
  }
  stack0xffffffffffffff08 = ZEXT816(0);
  local_118._16_8_ = 0.0;
  local_118._24_8_ = 0.0;
  local_118._0_8_ = 0.0;
  local_118._8_8_ = 0.0;
  lVar27 = uVar24 - 1;
  if (lVar27 == 0) {
    local_1c8 = 0.0;
    local_1b8 = 0.0;
    dStack_1b0 = 0.0;
    local_1d8 = 0.0;
  }
  else {
    local_1b8 = 0.0;
    dStack_1b0 = 0.0;
    local_1d8 = 0.0;
    local_1c8 = 0.0;
    lVar26 = uVar24 * 0x30;
    lVar28 = uVar24 * 0x60;
    lVar29 = uVar24 * 0x50;
    do {
      lVar25 = lVar29 + -0x50;
      uVar24 = (ulong)(model->lambda).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar27];
      if (uVar24 == 0) {
        Math::SpatialTransform::applyTranspose
                  ((SpatialRigidBodyInertia *)local_1a8,
                   (SpatialTransform *)
                   ((long)&(model->X_lambda).
                           super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].E.super_Matrix3d + lVar28),
                   (SpatialRigidBodyInertia *)
                   ((long)&(model->Ic).
                           super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].h.super_Vector3d +
                   lVar29 + -8));
        local_1d8 = local_1d8 + (double)local_1a8._0_8_;
        local_1b8 = local_1b8 + (double)local_1a8._8_8_;
        dStack_1b0 = dStack_1b0 + (double)local_1a8._16_8_;
        local_1c8 = local_1c8 + (double)local_1a8._24_8_;
        Math::SpatialTransform::applyTranspose
                  ((SpatialTransform *)
                   ((long)&(model->X_lambda).
                           super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].E.super_Matrix3d + lVar28),
                   (SpatialVector *)
                   ((long)&(model->hc).
                           super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                           .
                           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].
                           super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar26));
        Math::SpatialTransform::applyTranspose
                  ((SpatialTransform *)
                   ((long)&(model->X_lambda).
                           super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].E.super_Matrix3d + lVar28),
                   (SpatialVector *)
                   ((long)&(model->hdotc).
                           super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                           .
                           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].
                           super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar26));
        local_118._0_8_ = (double)local_118._0_8_ + (double)local_1a8._0_8_;
        local_118._8_8_ = (double)local_118._8_8_ + (double)local_1a8._8_8_;
        local_118._16_8_ = (double)local_118._16_8_ + (double)local_1a8._16_8_;
        local_118._24_8_ = (double)local_118._24_8_ + (double)local_1a8._24_8_;
        dVar5 = dStack_f0 + (double)local_1a8._40_8_;
        unique0x100001ff = SUB84(dVar5,0);
        local_118._32_8_ = (double)local_118._32_8_ + (double)local_1a8._32_8_;
        unique0x10000203 = (int)((ulong)dVar5 >> 0x20);
      }
      else {
        local_148._0_8_ = lVar27;
        pSVar10 = (model->Ic).
                  super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_120 = lVar25;
        Math::SpatialTransform::applyTranspose
                  ((SpatialRigidBodyInertia *)local_1a8,
                   (SpatialTransform *)
                   ((long)&(model->X_lambda).
                           super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].E.super_Matrix3d + lVar28),
                   (SpatialRigidBodyInertia *)((long)&pSVar10[-1].h.super_Vector3d + lVar29 + -8));
        lVar25 = local_120;
        dVar33 = *(double *)&pSVar10[uVar24].h.super_Vector3d;
        dVar6 = (double)local_1a8._16_8_ + *(double *)((long)&pSVar10[uVar24].h.super_Vector3d + 8);
        dVar5 = pSVar10[uVar24].Izz;
        pSVar11 = (model->Ic).
                  super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pdVar1 = (double *)((long)&pSVar10[uVar24].h.super_Vector3d + 0x10);
        dVar7 = *pdVar1;
        dVar8 = pdVar1[1];
        pSVar11[uVar24].m = pSVar10[uVar24].m + (double)local_1a8._0_8_;
        dVar9 = pSVar10[uVar24].Iyx;
        dVar15 = (&pSVar10[uVar24].Iyx)[1];
        dVar16 = pSVar10[uVar24].Izx;
        dVar17 = (&pSVar10[uVar24].Izx)[1];
        auVar32._8_4_ = SUB84(dVar6,0);
        auVar32._0_8_ = (double)local_1a8._8_8_ + dVar33;
        auVar32._12_4_ = (int)((ulong)dVar6 >> 0x20);
        *(undefined1 (*) [16])&pSVar11[uVar24].h.super_Vector3d = auVar32;
        pdVar1 = (double *)((long)&pSVar11[uVar24].h.super_Vector3d + 0x10);
        *pdVar1 = dVar7 + (double)local_1a8._24_8_;
        pdVar1[1] = dVar8 + (double)local_1a8._32_8_;
        pSVar11[uVar24].Iyx = (double)local_1a8._40_8_ + dVar9;
        (&pSVar11[uVar24].Iyx)[1] = (double)local_1a8._48_8_ + dVar15;
        pSVar11[uVar24].Izx = (double)local_1a8._56_8_ + dVar16;
        (&pSVar11[uVar24].Izx)[1] = (double)local_1a8._64_8_ + dVar17;
        pSVar11[uVar24].Izz = dVar5 + (double)local_1a8._72_8_;
        pSVar12 = (model->hc).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        Math::SpatialTransform::applyTranspose
                  ((SpatialTransform *)
                   ((long)&(model->X_lambda).
                           super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].E.super_Matrix3d + lVar28),
                   (SpatialVector *)
                   ((long)&pSVar12[-1].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar26));
        pSVar13 = (model->hc).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar5 = *(double *)
                 ((long)&pSVar12[uVar24].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        *(double *)
         &pSVar13[uVar24].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
             *(double *)
              &pSVar12[uVar24].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
             (double)local_1a8._0_8_;
        *(double *)
         ((long)&pSVar13[uVar24].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
             dVar5 + (double)local_1a8._8_8_;
        pdVar1 = (double *)
                 ((long)&pSVar12[uVar24].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar5 = pdVar1[1];
        pdVar4 = (double *)
                 ((long)&pSVar13[uVar24].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        *pdVar4 = *pdVar1 + (double)local_1a8._16_8_;
        pdVar4[1] = dVar5 + (double)local_1a8._24_8_;
        pdVar1 = (double *)
                 ((long)&pSVar12[uVar24].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar5 = pdVar1[1];
        pdVar4 = (double *)
                 ((long)&pSVar13[uVar24].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        *pdVar4 = *pdVar1 + (double)local_1a8._32_8_;
        pdVar4[1] = dVar5 + (double)local_1a8._40_8_;
        pSVar12 = (model->hdotc).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        Math::SpatialTransform::applyTranspose
                  ((SpatialTransform *)
                   ((long)&(model->X_lambda).
                           super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].E.super_Matrix3d + lVar28),
                   (SpatialVector *)
                   ((long)&pSVar12[-1].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar26));
        pSVar13 = (model->hdotc).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar5 = *(double *)
                 ((long)&pSVar12[uVar24].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        *(double *)
         &pSVar13[uVar24].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
             *(double *)
              &pSVar12[uVar24].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
             (double)local_1a8._0_8_;
        *(double *)
         ((long)&pSVar13[uVar24].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
             dVar5 + (double)local_1a8._8_8_;
        pdVar1 = (double *)
                 ((long)&pSVar12[uVar24].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar5 = pdVar1[1];
        pdVar4 = (double *)
                 ((long)&pSVar13[uVar24].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        *pdVar4 = *pdVar1 + (double)local_1a8._16_8_;
        pdVar4[1] = dVar5 + (double)local_1a8._24_8_;
        pdVar1 = (double *)
                 ((long)&pSVar12[uVar24].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar5 = pdVar1[1];
        pdVar4 = (double *)
                 ((long)&pSVar13[uVar24].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        *pdVar4 = *pdVar1 + (double)local_1a8._32_8_;
        pdVar4[1] = dVar5 + (double)local_1a8._40_8_;
        lVar27 = local_148._0_8_;
      }
      lVar27 = lVar27 + -1;
      lVar26 = lVar26 + -0x30;
      lVar28 = lVar28 + -0x60;
      lVar29 = lVar25;
    } while (lVar27 != 0);
  }
  local_148._8_8_ = local_1d8;
  local_148._0_8_ = local_1d8;
  auVar23._8_8_ = dStack_1b0;
  auVar23._0_8_ = local_1b8;
  register0x00001200 = divpd(auVar23,local_148._0_16_);
  local_150 = local_1c8 / local_1d8;
  local_1a8._8_8_ = 0.0;
  local_1a8._16_8_ = 0.0;
  local_1a8._24_8_ = 0.0;
  local_1a8._40_8_ = 0.0;
  local_1a8._48_8_ = 0.0;
  local_1a8._56_8_ = 0.0;
  local_1a8._0_8_ = 1.0;
  local_1a8._32_8_ = 1.0;
  local_1a8._64_8_ = 1.0;
  Math::SpatialTransform::applyAdjoint
            ((SpatialVector *)&local_c8,(SpatialTransform *)local_1a8,(SpatialVector *)local_118);
  local_118._0_8_ =
       local_1d8 * -0.0 +
       local_c8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  local_118._8_8_ =
       local_1d8 * -0.0 +
       local_c8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  local_118._16_8_ =
       local_c8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2] - (double)local_148._0_8_ * 0.0;
  local_118._24_8_ =
       local_c8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[3] -
       (model->gravity).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[0] * (double)local_148._8_8_;
  local_118._32_8_ =
       local_c8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[4] -
       (model->gravity).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[1] * (double)local_148._0_8_;
  dStack_f0 = local_c8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
              .m_storage.m_data.array[5] -
              (model->gravity).super_Vector3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
              * (double)local_148._8_8_;
  local_c8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] =
       ((double)local_1a8._72_8_ * -(double)local_1a8._0_8_ - dStack_158 * (double)local_1a8._24_8_)
       - local_150 * (double)local_1a8._48_8_;
  local_c8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] =
       ((double)local_1a8._72_8_ * -(double)local_1a8._8_8_ - dStack_158 * (double)local_1a8._32_8_)
       - local_150 * (double)local_1a8._56_8_;
  local_c8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] =
       (-(double)local_1a8._64_8_ * local_150 - dStack_158 * (double)local_1a8._40_8_) -
       (double)local_1a8._72_8_ * (double)local_1a8._16_8_;
  local_c8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[0] = (double)local_1a8._0_8_;
  local_c8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[1] = (double)local_1a8._24_8_;
  local_c8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[2] = (double)local_1a8._48_8_;
  local_c8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[3] = (double)local_1a8._8_8_;
  local_c8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[4] = (double)local_1a8._32_8_;
  local_c8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[5] = (double)local_1a8._56_8_;
  local_c8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[6] = (double)local_1a8._16_8_;
  local_c8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[7] = (double)local_1a8._40_8_;
  local_c8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[8] = (double)local_1a8._64_8_;
  Math::SpatialTransform::applyAdjoint(&local_68,&local_c8,(SpatialVector *)local_118);
  dVar5 = (local_130->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[0];
  dVar6 = (local_130->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[1];
  dVar33 = (local_130->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[2];
  auVar31._0_8_ =
       local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] *
       dVar6 - local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [1] * dVar33;
  auVar31._8_8_ =
       local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] *
       dVar33 - local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                [2] * dVar5;
  dVar33 = dVar33 * local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[5] +
           (local_130->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[1] *
           local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] +
           (local_130->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[0] *
           local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  auVar14._8_8_ = dVar33;
  auVar14._0_8_ = dVar33;
  auVar32 = divpd(auVar31,auVar14);
  *(undefined1 (*) [16])
   (local_128->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
   m_storage.m_data.array = auVar32;
  (local_128->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
  .m_data.array[2] =
       (local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] *
        dVar5 - local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                [0] * dVar6) / dVar33;
  return;
}

Assistant:

RBDL_DLLAPI void CalcZeroMomentPoint (
  Model &model,
  const Math::VectorNd &q,
  const Math::VectorNd &qdot,
  const Math::VectorNd &qddot,
  Vector3d* zmp,
  const Math::Vector3d &normal,
  const Math::Vector3d &point,
  bool update_kinematics
)
{
  if (zmp == NULL) {
    throw Errors::RBDLError("ZMP (output) is 'NULL'!\n");
  }

  // update kinematics if required
  // NOTE UpdateKinematics computes model.a[i] and model.v[i] required for
  //      change of momentum
  if (update_kinematics) {
    UpdateKinematicsCustom (model, &q, &qdot, &qddot);
  }

  // compute change of momentum of each single body (same as in RNEA/InverseDynamics)
  for (size_t i = 1; i < model.mBodies.size(); i++) {
    model.Ic[i] = model.I[i];
    model.hdotc[i] = model.Ic[i] * model.a[i] + crossf(model.v[i],
                     model.Ic[i] * model.v[i]);
  }

  SpatialRigidBodyInertia I_tot (0., Vector3d (0., 0., 0.), Matrix3d::Zero());
  SpatialVector h_tot (SpatialVector::Zero());
  SpatialVector hdot_tot (SpatialVector::Zero());

  // compute total change of momentum and CoM wrt to root body (idx = 0)
  // by recursively summing up local change of momentum
  for (size_t i = model.mBodies.size() - 1; i > 0; i--) {
    unsigned int lambda = model.lambda[i];

    if (lambda != 0) {
      model.Ic[lambda] = model.Ic[lambda] + model.X_lambda[i].applyTranspose (
                           model.Ic[i]);
      model.hc[lambda] = model.hc[lambda] + model.X_lambda[i].applyTranspose (
                           model.hc[i]);
      model.hdotc[lambda] = model.hdotc[lambda] + model.X_lambda[i].applyTranspose (
                              model.hdotc[i]);
    } else {
      I_tot = I_tot + model.X_lambda[i].applyTranspose (model.Ic[i]);
      h_tot = h_tot + model.X_lambda[i].applyTranspose (model.hc[i]);
      hdot_tot = hdot_tot + model.X_lambda[i].applyTranspose (model.hdotc[i]);
    }
  }

  // compute CoM from mass and total inertia
  const Scalar mass = I_tot.m;
  const Vector3d com = I_tot.h / mass;

  // project angular momentum onto CoM
  SpatialTransform Xcom = Xtrans (com);
  hdot_tot = Xcom.applyAdjoint (hdot_tot);

  // compute net external force at CoM by removing effects due to gravity
  hdot_tot = hdot_tot - mass * SpatialVector (0., 0., 0., model.gravity[0],
             model.gravity[1], model.gravity[2]);

  // express total change of momentum in world coordinates
  hdot_tot = Xcom.inverse().applyAdjoint (hdot_tot);

  // project purified change of momentum onto surface
  // z = n x n_0
  //     -------
  //     n * f
  Vector3d n_0 = hdot_tot.block<3,1>(0,0);
  Vector3d f = hdot_tot.block<3,1>(3,0);
  *zmp = normal.cross(n_0) / normal.dot(f);

  // double distance = (hdot_tot - point).dot(normal);
  // zmp = hdot_tot - distance * normal;

  return;
}